

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsPostsolveStack.h
# Opt level: O2

void __thiscall
presolve::HighsPostsolveStack::forcingRow<HighsTripletPositionSlice>
          (HighsPostsolveStack *this,HighsInt row,
          HighsMatrixSlice<HighsTripletPositionSlice> *rowVec,double side,RowType rowType)

{
  int iVar1;
  int iVar2;
  pointer pNVar3;
  HighsInt *pHVar4;
  int iVar5;
  double *pdVar6;
  int *piVar7;
  long lVar8;
  ForcingRow local_40;
  
  pNVar3 = (this->rowValues).
           super__Vector_base<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->rowValues).
      super__Vector_base<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
      ._M_impl.super__Vector_impl_data._M_finish != pNVar3) {
    (this->rowValues).
    super__Vector_base<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
    ._M_impl.super__Vector_impl_data._M_finish = pNVar3;
  }
  piVar7 = rowVec->nodeIndex;
  pdVar6 = rowVec->nodeValue;
  pHVar4 = rowVec->nodePositions;
  iVar1 = rowVec->len;
  iVar5 = 0;
  for (lVar8 = 0; (long)iVar1 * 4 != lVar8; lVar8 = lVar8 + 4) {
    iVar2 = *(int *)((long)pHVar4 + lVar8);
    iVar5 = iVar2 - iVar5;
    piVar7 = piVar7 + iVar5;
    pdVar6 = pdVar6 + iVar5;
    local_40.side = *pdVar6;
    std::
    vector<presolve::HighsPostsolveStack::Nonzero,std::allocator<presolve::HighsPostsolveStack::Nonzero>>
    ::emplace_back<int&,double>
              ((vector<presolve::HighsPostsolveStack::Nonzero,std::allocator<presolve::HighsPostsolveStack::Nonzero>>
                *)&this->rowValues,
               (this->origColIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start + *piVar7,&local_40.side);
    iVar5 = iVar2;
  }
  local_40.row = (this->origRowIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[row];
  local_40.side = side;
  local_40.rowType = rowType;
  HighsDataStack::push<presolve::HighsPostsolveStack::ForcingRow,_0>
            (&this->reductionValues,&local_40);
  HighsDataStack::push<presolve::HighsPostsolveStack::Nonzero>
            (&this->reductionValues,&this->rowValues);
  reductionAdded(this,kForcingRow);
  return;
}

Assistant:

void forcingRow(HighsInt row,
                  const HighsMatrixSlice<RowStorageFormat>& rowVec, double side,
                  RowType rowType) {
    rowValues.clear();
    for (const HighsSliceNonzero& rowVal : rowVec)
      rowValues.emplace_back(origColIndex[rowVal.index()], rowVal.value());

    reductionValues.push(ForcingRow{side, origRowIndex[row], rowType});
    reductionValues.push(rowValues);
    reductionAdded(ReductionType::kForcingRow);
  }